

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O1

uint8_t get_superres_denom_for_qindex(AV1_COMP *cpi,int qindex,int sr_kf,int sr_arf)

{
  FRAME_UPDATE_TYPE FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  uint8_t *puVar7;
  bool bVar8;
  byte bVar9;
  int k;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  double *pdVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int jj;
  long lVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  uint64_t freq_energy [16];
  double energy [16];
  int32_t coeff [64];
  long local_238 [14];
  double local_1c8 [18];
  int32_t local_138;
  int aiStack_134 [16];
  int aiStack_f4 [16];
  int aiStack_b4 [16];
  int aiStack_74 [17];
  
  pAVar5 = cpi->ppi;
  FVar1 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
  if ((FVar1 == '\x03') || (bVar11 = 8, FVar1 == '\0')) {
    pYVar6 = cpi->source;
    iVar2 = (cpi->td).mb.e_mbd.bd;
    iVar3 = (pYVar6->field_2).field_0.y_crop_width;
    iVar4 = (pYVar6->field_3).field_0.y_crop_height;
    local_238[0] = 0;
    local_238[1] = 0;
    local_238[2] = 0;
    local_238[3] = 0;
    local_238[4] = 0;
    local_238[5] = 0;
    local_238[6] = 0;
    local_238[7] = 0;
    local_238[8] = 0;
    local_238[9] = 0;
    local_238[10] = 0;
    local_238[0xb] = 0;
    local_238[0xc] = 0;
    local_238[0xd] = 0;
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    if ((pYVar6->flags & 8) == 0) {
      iVar18 = 0;
      if (4 < iVar4) {
        iVar15 = 0;
        iVar18 = 0;
        do {
          if (0x10 < iVar3) {
            iVar14 = 0;
            do {
              lVar16 = 0;
              pdVar13 = local_1c8 + 2;
              iVar12 = iVar15;
              do {
                lVar17 = 0;
                do {
                  *(ushort *)((long)pdVar13 + lVar17 * 2) =
                       (ushort)(pYVar6->field_5).buffers[0]
                               [lVar17 + (long)iVar14 +
                                         (long)(pYVar6->field_4).field_0.y_stride * (long)iVar12];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 0x10);
                lVar16 = lVar16 + 1;
                pdVar13 = pdVar13 + 4;
                iVar12 = iVar12 + 1;
              } while (lVar16 != 4);
              (*av1_fwd_txfm2d_16x4)((int16_t *)(local_1c8 + 2),&local_138,0x10,'\v',iVar2);
              lVar16 = 0;
              do {
                local_238[lVar16 + 1] =
                     local_238[lVar16 + 1] +
                     ((long)aiStack_b4[lVar16] * (long)aiStack_b4[lVar16] +
                      (long)aiStack_f4[lVar16] * (long)aiStack_f4[lVar16] +
                      (long)aiStack_134[lVar16] * (long)aiStack_134[lVar16] +
                      (long)aiStack_74[lVar16] * (long)aiStack_74[lVar16] + 2U >> 2);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0xf);
              iVar18 = iVar18 + 1;
              iVar14 = iVar14 + 0x10;
            } while (iVar14 < iVar3 + -0x10);
          }
          iVar15 = iVar15 + 4;
        } while (iVar15 < iVar4 + -4);
      }
    }
    else {
      iVar18 = 0;
      if (4 < iVar4) {
        puVar7 = (pYVar6->field_5).field_0.y_buffer;
        bVar11 = (char)iVar2 * '\x02' - 0xe;
        iVar18 = 0;
        iVar15 = 0;
        do {
          if (0x10 < iVar3) {
            lVar16 = 0;
            do {
              iVar14 = (pYVar6->field_4).field_0.y_stride;
              (*av1_fwd_txfm2d_16x4)
                        ((int16_t *)((long)puVar7 * 2 + (long)(iVar14 * iVar15) * 2 + lVar16 * 2),
                         &local_138,iVar14,'\v',iVar2);
              lVar17 = 0;
              do {
                local_238[lVar17 + 1] =
                     local_238[lVar17 + 1] +
                     ((long)aiStack_74[lVar17] * (long)aiStack_74[lVar17] +
                      (long)aiStack_b4[lVar17] * (long)aiStack_b4[lVar17] +
                      (long)aiStack_f4[lVar17] * (long)aiStack_f4[lVar17] +
                      (long)aiStack_134[lVar17] * (long)aiStack_134[lVar17] +
                      (ulong)((uint)(1 << (bVar11 & 0x1f)) >> 1) >> (bVar11 & 0x3f));
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0xf);
              iVar18 = iVar18 + 1;
              lVar16 = lVar16 + 0x10;
            } while ((int)lVar16 < iVar3 + -0x10);
          }
          iVar15 = iVar15 + 4;
        } while (iVar15 < iVar4 + -4);
      }
    }
    if (iVar18 == 0) {
      lVar16 = 0;
      do {
        auVar21._8_4_ = (int)lVar16;
        auVar21._0_8_ = lVar16;
        auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar21 = (auVar21 | _DAT_004d9930) ^ _DAT_004d9940;
        if (auVar21._4_4_ == -0x80000000 && auVar21._0_4_ < -0x7ffffff1) {
          local_1c8[lVar16 + 3] = 1e+20;
          local_1c8[lVar16 + 4] = 1e+20;
        }
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0x10);
    }
    else {
      lVar16 = 1;
      do {
        local_1c8[lVar16 + 2] =
             (((double)CONCAT44(0x45300000,(int)((ulong)local_238[lVar16] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_238[lVar16]) - 4503599627370496.0)) /
             (double)iVar18;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      uVar10 = 0xf;
      do {
        local_1c8[0x11] = local_1c8[0x11] + local_1c8[uVar10 + 1];
        local_1c8[uVar10 + 1] = local_1c8[0x11];
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    FVar1 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
    if (FVar1 == '\x03') {
      dVar19 = 0.008;
    }
    else if (FVar1 == '\0') {
      dVar19 = *(double *)(&DAT_00513b50 + (ulong)((cpi->rc).frames_to_key < 2) * 8);
    }
    else {
      dVar19 = 0.0;
    }
    dVar20 = av1_convert_qindex_to_q(qindex,AOM_BITS_8);
    dVar20 = dVar19 * dVar20 * dVar20;
    if (local_1c8[3] * 0.2 <= dVar20) {
      dVar20 = local_1c8[3] * 0.2;
    }
    bVar9 = 8;
    uVar10 = 0x11;
    do {
      if (dVar20 < local_1c8[uVar10]) goto LAB_00237e6c;
      bVar9 = bVar9 + 1;
      uVar10 = uVar10 - 1;
    } while (9 < uVar10);
    bVar9 = 0x10;
LAB_00237e6c:
    bVar8 = true;
    if (((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_AUTO) &&
       ((cpi->sf).hl_sf.superres_auto_search_type != '\x02')) {
      bVar8 = (cpi->rc).frames_to_key < 2;
    }
    bVar11 = 9;
    if (9 < bVar9) {
      bVar11 = bVar9;
    }
    if (bVar8) {
      bVar11 = bVar9;
    }
  }
  return bVar11;
}

Assistant:

static uint8_t get_superres_denom_for_qindex(const AV1_COMP *cpi, int qindex,
                                             int sr_kf, int sr_arf) {
  // Use superres for Key-frames and Alt-ref frames only.
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE && !sr_kf) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE && !sr_arf) {
    return SCALE_NUMERATOR;
  }

  double energy[16];
  analyze_hor_freq(cpi, energy);

  const double energy_by_q2_thresh =
      get_energy_by_q2_thresh(gf_group, &cpi->rc, cpi->gf_frame_index);
  int denom = get_superres_denom_from_qindex_energy(
      qindex, energy, energy_by_q2_thresh, SUPERRES_ENERGY_BY_AC_THRESH);
  /*
  printf("\nenergy = [");
  for (int k = 1; k < 16; ++k) printf("%f, ", energy[k]);
  printf("]\n");
  printf("boost = %d\n",
         (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE)
             ? cpi->ppi->p_rc.kf_boost
             : cpi->rc.gfu_boost);
  printf("denom = %d\n", denom);
  */
  if (av1_superres_in_recode_allowed(cpi)) {
    assert(cpi->superres_mode != AOM_SUPERRES_NONE);
    // Force superres to be tried in the recode loop, as full-res is also going
    // to be tried anyway.
    denom = AOMMAX(denom, SCALE_NUMERATOR + 1);
  }
  return denom;
}